

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_CustomBulletAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  int iVar2;
  AActor *origin;
  int iVar3;
  VMValue *pVVar4;
  AActor *pAVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  bool local_1af;
  FName local_1ac;
  TAngle<double> local_1a8;
  TAngle<double> local_1a0;
  byte local_191;
  bool temp;
  AActor *local_188;
  AActor *proj;
  undefined1 local_168 [8];
  DVector3 pos;
  double y;
  double x;
  TAngle<double> local_138;
  TAngle<double> local_130;
  AActor *local_128;
  AActor *puff;
  int damage;
  TAngle<double> local_110;
  TAngle<double> local_108;
  TAngle<double> local_100;
  TAngle<double> local_f8;
  DAngle slope;
  DAngle angle;
  TAngle<double> local_e0;
  undefined1 local_d8 [16];
  TAngle<double> local_c8;
  TAngle<double> local_c0;
  TAngle<double> local_b8;
  TAngle<double> local_b0;
  uint local_a4;
  int laflags;
  DAngle bslope;
  DAngle bangle;
  int i;
  AActor *ref;
  double Spawnofs_xy;
  double Spawnheight;
  MetaClass *missile;
  int ptr;
  int flags;
  double range;
  MetaClass *pufftype;
  int damageperbullet;
  int numbullets;
  DAngle spread_z;
  DAngle spread_xy;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64d,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar6 = true, (param->field_0).field_1.atag != 1)) {
    bVar6 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar6) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64d,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = *(AActor **)&param->field_0;
  local_1af = true;
  if (origin != (AActor *)0x0) {
    local_1af = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
  }
  if (local_1af == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64d,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64e,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64e,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  TAngle<double>::TAngle(&spread_z,param[1].field_0.f);
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64f,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64f,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  TAngle<double>::TAngle((TAngle<double> *)&damageperbullet,param[2].field_0.f);
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x650,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x650,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  iVar1 = param[3].field_0.i;
  if (numparam < 5) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x651,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[4].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x651,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  iVar2 = param[4].field_0.i;
  if (numparam < 6) {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    bVar6 = false;
    if ((pVVar4->field_0).field_3.Type == '\x03') {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      bVar6 = true;
      if ((pVVar4->field_0).field_1.atag != 1) {
        pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        bVar6 = (pVVar4->field_0).field_1.a == (void *)0x0;
      }
    }
    if (!bVar6) {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x652,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    range = (pVVar4->field_0).f;
  }
  else {
    bVar6 = false;
    if ((param[5].field_0.field_3.Type == '\x03') &&
       (bVar6 = true, param[5].field_0.field_1.atag != 1)) {
      bVar6 = param[5].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar6) {
      __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x652,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    range = param[5].field_0.f;
  }
  if (numparam < 7) {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    if ((pVVar4->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x653,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    _ptr = (pVVar4->field_0).f;
  }
  else {
    if (param[6].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x653,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    _ptr = param[6].field_0.f;
  }
  if (numparam < 8) {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
    if ((pVVar4->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x654,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
    missile._4_4_ = (pVVar4->field_0).i;
  }
  else {
    if (param[7].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x654,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    missile._4_4_ = param[7].field_0.i;
  }
  if (numparam < 9) {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
    if ((pVVar4->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x655,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
    missile._0_4_ = (pVVar4->field_0).i;
  }
  else {
    if (param[8].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x655,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    missile._0_4_ = param[8].field_0.i;
  }
  if (numparam < 10) {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
    bVar6 = false;
    if ((pVVar4->field_0).field_3.Type == '\x03') {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
      bVar6 = true;
      if ((pVVar4->field_0).field_1.atag != 1) {
        pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
        bVar6 = (pVVar4->field_0).field_1.a == (void *)0x0;
      }
    }
    if (!bVar6) {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x656,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
    Spawnheight = (pVVar4->field_0).f;
  }
  else {
    bVar6 = false;
    if ((param[9].field_0.field_3.Type == '\x03') &&
       (bVar6 = true, param[9].field_0.field_1.atag != 1)) {
      bVar6 = param[9].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar6) {
      __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x656,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    Spawnheight = param[9].field_0.f;
  }
  if (numparam < 0xb) {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
    if ((pVVar4->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x657,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
    Spawnofs_xy = (pVVar4->field_0).f;
  }
  else {
    if (param[10].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x657,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    Spawnofs_xy = param[10].field_0.f;
  }
  if (numparam < 0xc) {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
    if ((pVVar4->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x658,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
    ref = (AActor *)(pVVar4->field_0).field_1.a;
  }
  else {
    if (param[0xb].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x658,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    ref = (AActor *)param[0xb].field_0.field_1.a;
  }
  pAVar5 = COPY_AAPTR(origin,(int)missile);
  if ((_ptr == 0.0) && (!NAN(_ptr))) {
    _ptr = 2048.0;
  }
  TAngle<double>::TAngle(&bslope);
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffff60,0.0);
  local_a4 = 0;
  if ((missile._4_4_ & 0x10) != 0) {
    local_a4 = 2;
  }
  if ((pAVar5 != (AActor *)0x0) || ((missile._4_4_ & 1) != 0)) {
    if ((missile._4_4_ & 1) == 0) {
      TAngle<double>::TAngle(&local_b0,0.0);
      TAngle<double>::TAngle(&local_b8,270.0);
      TAngle<double>::TAngle(&local_c0,0.0);
      TAngle<double>::TAngle(&local_c8,0.0);
      A_Face(origin,pAVar5,&local_b0,&local_b8,&local_c0,&local_c8,0,0.0);
    }
    TAngle<double>::operator=(&bslope,&(origin->Angles).Yaw);
    if ((missile._4_4_ & 8) == 0) {
      TAngle<double>::TAngle((TAngle<double> *)local_d8,&bslope);
      TAngle<double>::TAngle(&local_e0,0.0);
      P_AimLineAttack((AActor *)(local_d8 + 8),(DAngle *)origin,2048.0,
                      (FTranslatedLineTarget *)local_d8,(DAngle *)0x0,(int)&local_e0,(AActor *)0x0,
                      (AActor *)0x0);
      TAngle<double>::operator=
                ((TAngle<double> *)&stack0xffffffffffffff60,(TAngle<double> *)(local_d8 + 8));
    }
    if (range == 0.0) {
      range = (double)PClass::FindActor(NAME_BulletPuff);
    }
    FSoundID::FSoundID((FSoundID *)((long)&angle.Degrees + 4),&(origin->AttackSound).super_FSoundID)
    ;
    S_Sound(origin,1,(FSoundID *)((long)&angle.Degrees + 4),1.0,1.0);
    for (bangle.Degrees._4_4_ = 0; bangle.Degrees._4_4_ < iVar1;
        bangle.Degrees._4_4_ = bangle.Degrees._4_4_ + 1) {
      TAngle<double>::TAngle(&slope,&bslope);
      TAngle<double>::TAngle(&local_f8,(TAngle<double> *)&stack0xffffffffffffff60);
      if ((missile._4_4_ & 4) == 0) {
        iVar3 = FRandom::Random2(&pr_cwbullet);
        TAngle<double>::operator*(&local_110,(double)iVar3 / 255.0);
        TAngle<double>::operator+=(&slope,&local_110);
        iVar3 = FRandom::Random2(&pr_cwbullet);
        TAngle<double>::operator*((TAngle<double> *)&stack0xfffffffffffffee8,(double)iVar3 / 255.0);
        TAngle<double>::operator+=(&local_f8,(TAngle<double> *)&stack0xfffffffffffffee8);
      }
      else {
        TAngle<double>::TAngle(&local_100,&spread_z);
        TAngle<double>::operator+=(&slope,&local_100);
        TAngle<double>::TAngle(&local_108,(TAngle<double> *)&damageperbullet);
        TAngle<double>::operator+=(&local_f8,&local_108);
      }
      puff._4_4_ = iVar2;
      if ((missile._4_4_ & 2) == 0) {
        iVar3 = FRandom::operator()(&pr_cabullet);
        puff._4_4_ = (iVar3 % 3 + 1) * puff._4_4_;
      }
      TAngle<double>::TAngle(&local_130,&slope);
      TAngle<double>::TAngle(&local_138,&local_f8);
      iVar3 = puff._4_4_;
      FName::FName((FName *)((long)&x + 4),NAME_Hitscan);
      local_128 = P_LineAttack(origin,&local_130,_ptr,&local_138,iVar3,(FName *)((long)&x + 4),
                               (PClassActor *)range,local_a4,(FTranslatedLineTarget *)0x0,(int *)0x0
                              );
      if ((Spawnheight != 0.0) && (range != 0.0)) {
        dVar7 = TAngle<double>::Cos(&slope);
        dVar8 = TAngle<double>::Sin(&slope);
        pos.Z = (double)ref * dVar8;
        AActor::Pos((DVector3 *)local_168,origin);
        AActor::Vec3Offset((DVector3 *)&proj,origin,(double)ref * dVar7,pos.Z,0.0,false);
        AActor::SetXYZ(origin,(DVector3 *)&proj);
        dVar7 = AActor::Z(origin);
        dVar8 = AActor::GetBobOffset(origin,0.0);
        TAngle<double>::TAngle((TAngle<double> *)&stack0xfffffffffffffe70,&(origin->Angles).Yaw);
        pAVar5 = GetDefaultByType((PClass *)Spawnheight);
        local_188 = P_SpawnMissileAngleZSpeed
                              (origin,dVar7 + dVar8 + Spawnofs_xy,(PClassActor *)Spawnheight,
                               (DAngle *)&stack0xfffffffffffffe70,0.0,pAVar5->Speed,origin,false);
        AActor::SetXYZ(origin,(DVector3 *)local_168);
        if (local_188 != (AActor *)0x0) {
          local_191 = local_128 == (AActor *)0x0;
          if (local_128 == (AActor *)0x0) {
            TAngle<double>::TAngle(&local_1a0,&slope);
            TAngle<double>::TAngle(&local_1a8,&local_f8);
            FName::FName(&local_1ac,NAME_Hitscan);
            local_128 = P_LineAttack(origin,&local_1a0,_ptr,&local_1a8,0,&local_1ac,
                                     (PClassActor *)range,local_a4 | 8,(FTranslatedLineTarget *)0x0,
                                     (int *)0x0);
          }
          if (local_128 != (AActor *)0x0) {
            AimBulletMissile(local_188,local_128,missile._4_4_,(bool)(local_191 & 1),true);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomBulletAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE		(spread_xy);
	PARAM_ANGLE		(spread_z);
	PARAM_INT		(numbullets);
	PARAM_INT		(damageperbullet);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_FLOAT_DEF	(range);
	PARAM_INT_DEF	(flags);
	PARAM_INT_DEF	(ptr);
	PARAM_CLASS_DEF (missile, AActor);
	PARAM_FLOAT_DEF (Spawnheight);
	PARAM_FLOAT_DEF (Spawnofs_xy);

	AActor *ref = COPY_AAPTR(self, ptr);

	if (range == 0)
		range = MISSILERANGE;

	int i;
	DAngle bangle;
	DAngle bslope = 0.;
	int laflags = (flags & CBAF_NORANDOMPUFFZ)? LAF_NORANDOMPUFFZ : 0;

	if (ref != NULL || (flags & CBAF_AIMFACING))
	{
		if (!(flags & CBAF_AIMFACING))
		{
			A_Face(self, ref);
		}
		bangle = self->Angles.Yaw;

		if (!(flags & CBAF_NOPITCH)) bslope = P_AimLineAttack (self, bangle, MISSILERANGE);
		if (pufftype == nullptr) pufftype = PClass::FindActor(NAME_BulletPuff);

		S_Sound (self, CHAN_WEAPON, self->AttackSound, 1, ATTN_NORM);
		for (i = 0; i < numbullets; i++)
		{
			DAngle angle = bangle;
			DAngle slope = bslope;

			if (flags & CBAF_EXPLICITANGLE)
			{
				angle += spread_xy;
				slope += spread_z;
			}
			else
			{
				angle += spread_xy * (pr_cwbullet.Random2() / 255.);
				slope += spread_z * (pr_cwbullet.Random2() / 255.);
			}

			int damage = damageperbullet;

			if (!(flags & CBAF_NORANDOM))
				damage *= ((pr_cabullet()%3)+1);

			AActor *puff = P_LineAttack(self, angle, range, slope, damage, NAME_Hitscan, pufftype, laflags);
			if (missile != nullptr && pufftype != nullptr)
			{
				double x = Spawnofs_xy * angle.Cos();
				double y = Spawnofs_xy * angle.Sin();
				
				DVector3 pos = self->Pos();
				self->SetXYZ(self->Vec3Offset(x, y, 0.));
				AActor *proj = P_SpawnMissileAngleZSpeed(self, self->Z() + self->GetBobOffset() + Spawnheight, missile, self->Angles.Yaw, 0, GetDefaultByType(missile)->Speed, self, false);
				self->SetXYZ(pos);
				
				if (proj)
				{
					bool temp = (puff == nullptr);
					if (!puff)
					{
						puff = P_LineAttack(self, angle, range, slope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
					}
					if (puff)
					{			
						AimBulletMissile(proj, puff, flags, temp, true);
					}
				}
			}
		}
    }
	return 0;
}